

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

void Saig_SynchSetConstant1(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  int local_34;
  int w;
  uint *pSim;
  Aig_Obj_t *pObj;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  pAVar1 = Aig_ManConst1(pAig);
  pvVar2 = Vec_PtrEntry(vSimInfo,pAVar1->Id);
  for (local_34 = 0; local_34 < nWords; local_34 = local_34 + 1) {
    *(undefined4 *)((long)pvVar2 + (long)local_34 * 4) = 0x55555555;
  }
  return;
}

Assistant:

void Saig_SynchSetConstant1( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int w;
    pObj = Aig_ManConst1( pAig );
    pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
    for ( w = 0; w < nWords; w++ )
        pSim[w] = 0x55555555;
}